

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

void __thiscall w3Module::read_tables(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  reference pvVar2;
  w3TableType wVar3;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  size_t i;
  string local_40;
  ulong local_20;
  size_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  size = (size_t)cursor;
  cursor_local = (uint8_t **)this;
  uVar1 = read_varuint32(this,cursor);
  local_20 = (ulong)uVar1;
  printf("reading tables size:%lX\n",local_20);
  if (local_20 != 1) {
    StringFormat_abi_cxx11_(&local_40,"%lX",local_20);
    AssertFailedFormat("size == 1",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::vector<w3TableType,_std::allocator<w3TableType>_>::resize(&this->tables,local_20);
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    wVar3 = read_tabletype(this,(uint8_t **)size);
    pvVar2 = std::vector<w3TableType,_std::allocator<w3TableType>_>::operator[](&this->tables,0);
    local_70 = wVar3._0_8_;
    pvVar2->elementType = (undefined1)local_70;
    *(undefined3 *)&pvVar2->field_0x1 = local_70._1_3_;
    (pvVar2->limits).min = local_70._4_4_;
    local_68 = wVar3.limits._4_8_;
    (pvVar2->limits).max = (undefined4)local_68;
    (pvVar2->limits).hasMax = (bool)local_68._4_1_;
    *(undefined3 *)&(pvVar2->limits).field_0x9 = local_68._5_3_;
  }
  return;
}

Assistant:

void w3Module::read_tables (uint8_t** cursor)
{
    const size_t size = read_varuint32 (cursor);
    printf ("reading tables size:%" FORMAT_SIZE "X\n", size);
    AssertFormat (size == 1, ("%" FORMAT_SIZE "X", size));
    tables.resize (size);
    for (size_t i = 0; i < size; ++i)
        tables [0] = read_tabletype (cursor);
}